

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O3

void setFitting(Settings *s,Data *d)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ostream *poVar5;
  long *plVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 uVar17;
  undefined4 uVar18;
  
  if (s->fit == true) {
    pdVar4 = (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (d->lons).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar7 = pdVar4 + 1;
    dVar13 = *pdVar4;
    pdVar8 = pdVar4;
    pdVar9 = pdVar7;
    if (pdVar7 == pdVar2 || pdVar4 == pdVar2) {
      s->minx = dVar13;
    }
    else {
      do {
        dVar14 = *pdVar9;
        uVar17 = SUB84(dVar14,0);
        uVar18 = (undefined4)((ulong)dVar14 >> 0x20);
        pdVar3 = pdVar9;
        if (dVar13 <= dVar14) {
          uVar17 = SUB84(dVar13,0);
          uVar18 = (undefined4)((ulong)dVar13 >> 0x20);
          pdVar3 = pdVar8;
        }
        pdVar9 = pdVar9 + 1;
        dVar13 = (double)CONCAT44(uVar18,uVar17);
        pdVar8 = pdVar3;
      } while (pdVar9 != pdVar2);
      s->minx = *pdVar3;
      dVar13 = *pdVar4;
      do {
        dVar14 = *pdVar7;
        uVar17 = SUB84(dVar14,0);
        uVar18 = (undefined4)((ulong)dVar14 >> 0x20);
        pdVar8 = pdVar7;
        if (dVar14 <= dVar13) {
          uVar17 = SUB84(dVar13,0);
          uVar18 = (undefined4)((ulong)dVar13 >> 0x20);
          pdVar8 = pdVar4;
        }
        pdVar4 = pdVar8;
        pdVar7 = pdVar7 + 1;
        dVar13 = (double)CONCAT44(uVar18,uVar17);
      } while (pdVar7 != pdVar2);
    }
    s->maxx = *pdVar4;
    pdVar4 = (d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (d->lats).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar7 = pdVar4 + 1;
    dVar13 = *pdVar4;
    pdVar8 = pdVar4;
    pdVar9 = pdVar7;
    if (pdVar7 == pdVar2 || pdVar4 == pdVar2) {
      s->miny = dVar13;
    }
    else {
      do {
        dVar14 = *pdVar9;
        uVar17 = SUB84(dVar14,0);
        uVar18 = (undefined4)((ulong)dVar14 >> 0x20);
        pdVar3 = pdVar9;
        if (dVar13 <= dVar14) {
          uVar17 = SUB84(dVar13,0);
          uVar18 = (undefined4)((ulong)dVar13 >> 0x20);
          pdVar3 = pdVar8;
        }
        pdVar9 = pdVar9 + 1;
        dVar13 = (double)CONCAT44(uVar18,uVar17);
        pdVar8 = pdVar3;
      } while (pdVar9 != pdVar2);
      s->miny = *pdVar3;
      dVar13 = *pdVar4;
      do {
        dVar14 = *pdVar7;
        uVar17 = SUB84(dVar14,0);
        uVar18 = (undefined4)((ulong)dVar14 >> 0x20);
        pdVar8 = pdVar7;
        if (dVar14 <= dVar13) {
          uVar17 = SUB84(dVar13,0);
          uVar18 = (undefined4)((ulong)dVar13 >> 0x20);
          pdVar8 = pdVar4;
        }
        pdVar4 = pdVar8;
        pdVar7 = pdVar7 + 1;
        dVar13 = (double)CONCAT44(uVar18,uVar17);
      } while (pdVar7 != pdVar2);
    }
    s->maxy = *pdVar4;
    if (s->mapType != heat) {
      pdVar4 = (d->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (d->scas).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar7 = pdVar4 + 1;
      dVar13 = *pdVar4;
      pdVar8 = pdVar4;
      pdVar9 = pdVar7;
      if (pdVar7 == pdVar2 || pdVar4 == pdVar2) {
        s->mins = dVar13;
      }
      else {
        do {
          dVar14 = *pdVar9;
          uVar17 = SUB84(dVar14,0);
          uVar18 = (undefined4)((ulong)dVar14 >> 0x20);
          pdVar3 = pdVar9;
          if (dVar13 <= dVar14) {
            uVar17 = SUB84(dVar13,0);
            uVar18 = (undefined4)((ulong)dVar13 >> 0x20);
            pdVar3 = pdVar8;
          }
          pdVar9 = pdVar9 + 1;
          dVar13 = (double)CONCAT44(uVar18,uVar17);
          pdVar8 = pdVar3;
        } while (pdVar9 != pdVar2);
        s->mins = *pdVar3;
        dVar13 = *pdVar4;
        do {
          dVar14 = *pdVar7;
          uVar17 = SUB84(dVar14,0);
          uVar18 = (undefined4)((ulong)dVar14 >> 0x20);
          pdVar8 = pdVar7;
          if (dVar14 <= dVar13) {
            uVar17 = SUB84(dVar13,0);
            uVar18 = (undefined4)((ulong)dVar13 >> 0x20);
            pdVar8 = pdVar4;
          }
          pdVar4 = pdVar8;
          pdVar7 = pdVar7 + 1;
          dVar13 = (double)CONCAT44(uVar18,uVar17);
        } while (pdVar7 != pdVar2);
      }
      s->maxs = *pdVar4;
    }
  }
  if (s->fitnx == true) {
    dVar13 = s->maxx;
    dVar14 = s->miny;
    dVar11 = s->maxy;
    dVar12 = s->minx;
    iVar1 = s->ny;
    dVar10 = cos(((dVar14 + dVar11) * 0.5 * pi) / 180.0);
    s->nx = (int)((dVar10 * (double)iVar1 * (dVar13 - dVar12)) / (dVar11 - dVar14));
  }
  if (s->fitny == true) {
    dVar13 = s->maxx;
    dVar14 = s->miny;
    dVar11 = s->maxy;
    dVar12 = s->minx;
    iVar1 = s->nx;
    dVar10 = cos(((dVar14 + dVar11) * 0.5 * pi) / 180.0);
    s->ny = (int)((((double)iVar1 / dVar10) * (dVar11 - dVar14)) / (dVar13 - dVar12));
  }
  if (s->fitx == true) {
    dVar13 = s->miny;
    dVar11 = (s->minx + s->maxx) * 0.5;
    dVar14 = s->maxy;
    dVar12 = cos(((dVar13 + dVar14) * 0.5 * pi) / 180.0);
    dVar13 = ((double)s->nx * ((dVar14 - dVar13) / dVar12)) / (double)s->ny;
    s->minx = dVar13 * -0.5 + dVar11;
    s->maxx = dVar13 * 0.5 + dVar11;
  }
  if (s->fity == false) {
    dVar14 = s->miny;
    dVar13 = s->maxy;
  }
  else {
    dVar14 = s->maxx;
    dVar13 = (s->miny + s->maxy) * 0.5;
    dVar11 = s->minx;
    dVar12 = cos((pi * dVar13) / 180.0);
    dVar11 = (((double)s->ny * dVar12) / (double)s->nx) * (dVar14 - dVar11);
    dVar14 = dVar11 * -0.5 + dVar13;
    dVar13 = dVar11 * 0.5 + dVar13;
  }
  dVar11 = s->margin;
  dVar12 = s->maxx - s->minx;
  s->minx = dVar12 * -dVar11 + s->minx;
  s->maxx = dVar12 * dVar11 + s->maxx;
  s->miny = (dVar13 - dVar14) * -dVar11 + dVar14;
  s->maxy = (dVar13 - dVar14) * dVar11 + dVar13;
  if ((s->fitnx != false) || (s->fitny == true)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Resizing image to ",0x12);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,s->nx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,s->ny);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
  }
  if ((((s->fit != false) || (s->fitx != false)) || (s->fity != false)) ||
     ((s->margin != 0.0 || (NAN(s->margin))))) {
    printBounds(s);
  }
  if (s->mapType != heat) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
    poVar5 = std::ostream::_M_insert<double>(s->mins);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," <= scalar <= ",0xe);
    poVar5 = std::ostream::_M_insert<double>(s->maxs);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  dVar14 = s->maxx - s->minx;
  dVar13 = s->maxy - s->miny;
  auVar15._0_8_ = dVar14 * dVar14;
  auVar15._8_8_ = (double)s->nx * (double)s->nx;
  dVar14 = (double)s->ny * (double)s->ny + auVar15._8_8_;
  auVar16._8_4_ = SUB84(dVar14,0);
  auVar16._0_8_ = dVar13 * dVar13 + auVar15._0_8_;
  auVar16._12_4_ = (int)((ulong)dVar14 >> 0x20);
  auVar16 = sqrtpd(auVar15,auVar16);
  s->degPerPix = auVar16._0_8_ / auVar16._8_8_;
  if (s->sampling == autosample) {
    dVar13 = getAvgLength(s,d);
    s->sampling = (uint)(0.5 <= dVar13 / (double)s->r) * 2;
  }
  return;
}

Assistant:

void setFitting(Settings& s, Data& d)
{
	// Get the image bounds depending on which input options were
	// specified, and from the zoom level, set the sampling
	// strategy.

	if (s.fit)
	{
		s.minx = *min_element(begin(d.lons), end(d.lons));
		s.maxx = *max_element(begin(d.lons), end(d.lons));
		s.miny = *min_element(begin(d.lats), end(d.lats));
		s.maxy = *max_element(begin(d.lats), end(d.lats));

		if (s.mapType != heat)
		{
			s.mins = *min_element(begin(d.scas), end(d.scas));
			s.maxs = *max_element(begin(d.scas), end(d.scas));
		}
	}

	if (s.fitnx)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = s.maxy - s.miny;
		s.nx = s.ny * cos(avgy * pi / 180.0) * difx / dify;
	}

	if (s.fitny)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = s.maxy - s.miny;
		s.ny = s.nx / cos(avgy * pi / 180.0) * dify / difx;
	}

	if (s.fitx)
	{
		double avgx = 0.5 * (s.minx + s.maxx);
		double avgy = 0.5 * (s.miny + s.maxy);
		double dify = s.maxy - s.miny;
		double difx = dify / cos(avgy * pi / 180.0) * s.nx / s.ny;
		s.minx = avgx - 0.5 * difx;
		s.maxx = avgx + 0.5 * difx;
	}

	if (s.fity)
	{
		double avgy = 0.5 * (s.miny + s.maxy);
		double difx = s.maxx - s.minx;
		double dify = cos(avgy * pi / 180.0) * s.ny / s.nx * difx;
		s.miny = avgy - 0.5 * dify;
		s.maxy = avgy + 0.5 * dify;
	}

	double difx = s.maxx - s.minx;
	double dify = s.maxy - s.miny;
	s.minx -= s.margin * difx;
	s.maxx += s.margin * difx;
	s.miny -= s.margin * dify;
	s.maxy += s.margin * dify;

	if (s.fitnx || s.fitny)
	{
		std::cout << "Resizing image to " << s.nx << ", " << s.ny << std::endl;
	}

	if (s.fit || s.fitx || s.fity || s.margin != 0.0)
		printBounds(s);

	if (s.mapType != heat)
		std::cout << "\t" << s.mins << " <= scalar <= " << s.maxs << std::endl;

	s.degPerPix
			= sqrt(pow(s.maxx - s.minx, 2) + pow(s.maxy - s.miny, 2))
			/ sqrt(pow(s.nx           , 2) + pow(s.ny           , 2));

	if (s.sampling == autosample)
	{
		double lenavgpix = getAvgLength(s, d);
		if (lenavgpix / s.r < 0.5)  // TODO:  this limit depends on kernel type
			s.sampling = pointwise;
		else
			s.sampling = linear;
	}
}